

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Text>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  WirePointer *pWVar1;
  WirePointer *pWVar2;
  word *pwVar3;
  Arena *pAVar4;
  ulong uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  WirePointer *pWVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  char *condition;
  ulong uVar13;
  WirePointer *pWVar14;
  Reader RVar15;
  Fault f;
  SegmentReader *pSVar7;
  
  pSVar7 = this->segment;
  pWVar14 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar14 = this->pointer;
  }
  pWVar1 = pWVar14 + 1;
  uVar10 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
  lVar12 = (long)((int)uVar10 >> 2);
  if (pSVar7 == (SegmentReader *)0x0) {
    if (uVar10 == 0 && (pWVar14->field_1).upper32Bits == 0) goto LAB_002398a6;
    pWVar9 = pWVar1 + lVar12;
    pSVar7 = (SegmentReader *)0x0;
LAB_00239692:
    uVar10 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
LAB_00239698:
    if ((uVar10 & 3) == 1) {
      uVar10 = (pWVar14->field_1).upper32Bits;
      if ((uVar10 & 7) == 2) {
        if (pSVar7 == (SegmentReader *)0x0) {
LAB_002396f7:
          if (uVar10 < 8) {
            condition = "size > ZERO * BYTES";
            iVar6 = 0x98a;
          }
          else {
            uVar11 = (ulong)((uVar10 >> 3) - 1);
            if (*(char *)((long)&(pWVar9->offsetAndKind).value + uVar11) == '\0') goto LAB_002398b6;
            condition = "cptr[unboundedSize] == \'\\0\'";
            iVar6 = 0x991;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar6,FAILED,condition,"\"Message contains text that is not NUL-terminated.\""
                     ,(char (*) [50])"Message contains text that is not NUL-terminated.");
        }
        else {
          uVar11 = (ulong)((uVar10 >> 3) + 7 >> 3);
          if (((long)pWVar9 - (long)(pSVar7->ptr).ptr >> 3) + uVar11 <= (pSVar7->ptr).size_) {
            uVar8 = pSVar7->readLimiter->limit;
            if (uVar11 <= uVar8) {
              pSVar7->readLimiter->limit = uVar8 - uVar11;
              goto LAB_002396f7;
            }
            (*pSVar7->arena->_vptr_Arena[3])();
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x986,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                     "\"Message contained out-of-bounds text pointer.\"",
                     (char (*) [46])"Message contained out-of-bounds text pointer.");
        }
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x981,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "\"Message contains list pointer of non-bytes where text was expected.\"",
                   (char (*) [68])
                   "Message contains list pointer of non-bytes where text was expected.");
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[59]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x97c,FAILED,"ref->kind() == WirePointer::LIST",
                 "\"Message contains non-list pointer where text was expected.\"",
                 (char (*) [59])"Message contains non-list pointer where text was expected.");
    }
LAB_0023989e:
    kj::_::Debug::Fault::~Fault(&f);
  }
  else {
    pwVar3 = (pSVar7->ptr).ptr;
    pWVar2 = (WirePointer *)(pwVar3 + (pSVar7->ptr).size_);
    pWVar9 = pWVar1 + lVar12;
    if ((long)pWVar2 - (long)pWVar1 >> 3 < lVar12) {
      pWVar9 = pWVar2;
    }
    if (lVar12 < (long)pwVar3 - (long)pWVar1 >> 3) {
      pWVar9 = pWVar2;
    }
    if ((pWVar14->field_1).upper32Bits != 0 || uVar10 != 0) {
      if (pSVar7 != (SegmentReader *)0x0) {
        if ((uVar10 & 3) != 2) goto LAB_00239689;
        iVar6 = (*pSVar7->arena->_vptr_Arena[2])();
        pSVar7 = (SegmentReader *)CONCAT44(extraout_var,iVar6);
        if (pSVar7 != (SegmentReader *)0x0) {
          uVar11 = (pSVar7->ptr).size_;
          uVar10 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
          uVar8 = (ulong)(uVar10 >> 3);
          if ((long)uVar11 < (long)(ulong)(uVar10 >> 3)) {
            uVar8 = uVar11;
          }
          uVar13 = 2 - (ulong)((uVar10 & 4) == 0);
          if (uVar11 < uVar8 + uVar13) {
LAB_0023986a:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                       "\"Message contains out-of-bounds far pointer.\"",
                       (char (*) [44])"Message contains out-of-bounds far pointer.");
            goto LAB_0023989e;
          }
          pwVar3 = (pSVar7->ptr).ptr;
          pAVar4 = pSVar7->arena;
          uVar5 = pSVar7->readLimiter->limit;
          if (uVar5 < uVar13) {
            (*pAVar4->_vptr_Arena[3])();
            goto LAB_0023986a;
          }
          pWVar14 = (WirePointer *)(pwVar3 + uVar8);
          pWVar1 = pWVar14 + 1;
          pSVar7->readLimiter->limit = uVar5 - uVar13;
          if ((uVar10 & 4) != 0) {
            iVar6 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar14->field_1).upper32Bits);
            pSVar7 = (SegmentReader *)CONCAT44(extraout_var_00,iVar6);
            if (pSVar7 == (SegmentReader *)0x0) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x24e,FAILED,"newSegment != nullptr",
                         "\"Message contains double-far pointer to unknown segment.\"",
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
            }
            else {
              uVar10 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
              if ((uVar10 & 3) == 2) {
                uVar8 = (ulong)(uVar10 >> 3);
                uVar11 = (pSVar7->ptr).size_;
                if ((long)uVar11 < (long)uVar8) {
                  uVar8 = uVar11;
                }
                pWVar9 = (WirePointer *)((pSVar7->ptr).ptr + uVar8);
                pWVar14 = pWVar1;
                goto LAB_00239689;
              }
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                         "\"Second word of double-far pad must be far pointer.\"",
                         (char (*) [51])"Second word of double-far pad must be far pointer.");
            }
            goto LAB_0023989e;
          }
          uVar10 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
          lVar12 = (long)((int)uVar10 >> 2);
          pWVar9 = (WirePointer *)(pwVar3 + uVar11);
          if ((lVar12 < (long)pwVar3 - (long)pWVar1 >> 3) ||
             ((long)pWVar9 - (long)pWVar1 >> 3 < lVar12)) goto LAB_00239692;
          pWVar9 = pWVar1 + lVar12;
          goto LAB_00239698;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x234,FAILED,"segment != nullptr",
                   "\"Message contains far pointer to unknown segment.\"",
                   (char (*) [49])"Message contains far pointer to unknown segment.");
        goto LAB_0023989e;
      }
      pSVar7 = (SegmentReader *)0x0;
LAB_00239689:
      if (pWVar9 != (WirePointer *)0x0) goto LAB_00239692;
    }
  }
LAB_002398a6:
  pWVar9 = (WirePointer *)0x2b02ed;
  if (defaultValue != (void *)0x0) {
    pWVar9 = (WirePointer *)defaultValue;
  }
  uVar11 = (ulong)defaultSize;
LAB_002398b6:
  RVar15.super_StringPtr.content.size_ = uVar11 + 1;
  RVar15.super_StringPtr.content.ptr = (char *)pWVar9;
  return (Reader)RVar15.super_StringPtr.content;
}

Assistant:

Text::Reader PointerReader::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readTextPointer(segment, ref, defaultValue, defaultSize);
}